

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall google::protobuf::EnumDescriptorProto::IsInitialized(EnumDescriptorProto *this)

{
  bool bVar1;
  
  bVar1 = internal::AllAreInitialized<google::protobuf::EnumValueDescriptorProto>(&this->value_);
  if (bVar1) {
    bVar1 = _internal_has_options(this);
    if (bVar1) {
      bVar1 = EnumOptions::IsInitialized(this->options_);
      if (!bVar1) goto LAB_002ced79;
    }
    bVar1 = true;
  }
  else {
LAB_002ced79:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool EnumDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(value_)) return false;
  if (_internal_has_options()) {
    if (!options_->IsInitialized()) return false;
  }
  return true;
}